

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_ConvertToRgb(ConvertToRgbForm1 ConvertToRgb)

{
  uint8_t value;
  bool bVar1;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  ImageTemplate<unsigned_char> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Image local_40;
  
  Unit_Test::intensityArray(&local_58,1);
  value = *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_40,value,0,0,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  (*ConvertToRgb)(&local_80,&local_40);
  if (local_80._colorCount == '\x03') {
    bVar1 = Unit_Test::verifyImage
                      (&local_80,
                       *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    bVar1 = false;
  }
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_ConvertToRgb(ConvertToRgbForm1 ConvertToRgb)
    {
        const std::vector < uint8_t > intensity = intensityArray( 1 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );

        const PenguinV_Image::Image output = ConvertToRgb( input );

        return output.colorCount() == PenguinV_Image::RGB && verifyImage( output, intensity[0] );
    }